

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_apu.c
# Opt level: O2

void NES_APU_np_Reset(void *chip)

{
  long lVar1;
  NES_APU *apu;
  int iVar2;
  
  *(undefined4 *)((long)chip + 0x30) = 0;
  for (lVar1 = 0x118; lVar1 != 0x11a; lVar1 = lVar1 + 1) {
    *(undefined4 *)((long)chip + lVar1 * 4 + -0x378) = 0;
    *(undefined4 *)((long)chip + lVar1 * 4 + -0x370) = 0;
    *(undefined4 *)((long)chip + lVar1 * 4 + -0x368) = 0;
    *(undefined4 *)((long)chip + lVar1 * 4 + -0x360) = 0;
    *(undefined4 *)((long)chip + lVar1 * 4 + -0x358) = 0;
    *(undefined4 *)((long)chip + lVar1 * 4 + -0x350) = 0;
    *(undefined1 *)((long)chip + lVar1) = 0;
    *(undefined1 *)((long)chip + lVar1 + 2) = 0;
    *(undefined1 *)((long)chip + lVar1 + 4) = 0;
    *(undefined4 *)((long)chip + lVar1 * 4 + -0x340) = 0;
    *(undefined4 *)((long)chip + lVar1 * 4 + -0x338) = 1;
    *(undefined4 *)((long)chip + lVar1 * 4 + -0x330) = 0;
    *(undefined1 *)((long)chip + lVar1 + 0x20) = 0;
    *(undefined1 *)((long)chip + lVar1 + 0x22) = 0;
    *(undefined1 *)((long)chip + lVar1 + 0x24) = 0;
    *(undefined4 *)((long)chip + lVar1 * 4 + -800) = 0;
    *(undefined4 *)((long)chip + lVar1 * 4 + -0x318) = 0;
    *(undefined4 *)((long)chip + lVar1 * 4 + -0x310) = 0;
    *(undefined4 *)((long)chip + lVar1 * 4 + -0x308) = 0;
    *(undefined1 *)((long)chip + lVar1 + 0x48) = 0;
  }
  for (iVar2 = -8; iVar2 != 0; iVar2 = iVar2 + 1) {
    NES_APU_np_Write(chip,(short)iVar2 + 0x4008,'\0');
  }
  *(undefined1 *)((long)chip + 0x49) = 0;
  *(undefined2 *)((long)chip + 0x160) = 0;
  *(undefined8 *)((long)chip + 0x158) = 0;
  if (*(int *)((long)chip + 8) != 0) {
    *(undefined2 *)((long)chip + 0x160) = 0x101;
    *(undefined1 *)((long)chip + 0x49) = 0xf;
  }
  if (*(int *)((long)chip + 0x18) != 0) {
    NES_APU_np_Write(chip,0x4001,'\b');
    NES_APU_np_Write(chip,0x4005,'\b');
  }
  *(undefined8 *)((long)chip + 0x54) = 0;
  NES_APU_np_SetRate(chip,*(UINT32 *)((long)chip + 0x5c));
  *(undefined8 *)((long)chip + 0x170) = 0;
  return;
}

Assistant:

void NES_APU_np_Reset(void* chip)
{
	NES_APU* apu = (NES_APU*)chip;
	int i;
	apu->gclock = 0;
	//apu->mask = 0;

	for (i=0; i<2; ++i)
	{
		apu->scounter[i] = 0;
		apu->sphase[i] = 0;
		apu->duty[i] = 0;
		apu->volume[i] = 0;
		apu->freq[i] = 0;
		apu->sfreq[i] = 0;
		apu->sweep_enable[i] = 0;
		apu->sweep_mode[i] = 0;
		apu->sweep_write[i] = 0;
		apu->sweep_div_period[i] = 0;
		apu->sweep_div[i] = 1;
		apu->sweep_amount[i] = 0;
		apu->envelope_disable[i] = 0;
		apu->envelope_loop[i] = 0;
		apu->envelope_write[i] = 0;
		apu->envelope_div_period[i] = 0;
		apu->envelope_div[i] = 0;
		apu->envelope_counter[i] = 0;
		apu->length_counter[i] = 0;
		apu->enable[i] = 0;
	}

	for (i = 0x4000; i < 0x4008; i++)
		NES_APU_np_Write(apu, i, 0);

	NES_APU_np_Write(apu, 0x4015, 0);
	if (apu->option[OPT_UNMUTE_ON_RESET])
		NES_APU_np_Write(apu, 0x4015, 0x0f);
	if (apu->option[OPT_NEGATE_SWEEP_INIT])
	{
		NES_APU_np_Write(apu, 0x4001, 0x08);
		NES_APU_np_Write(apu, 0x4005, 0x08);
	}

	for (i = 0; i < 2; i++)
		apu->out[i] = 0;

	NES_APU_np_SetRate(apu, apu->rate);
	RC_RESET(&apu->tick_count);
}